

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O3

void gray_set_cell(PWorker worker,TCoord ex,TCoord ey)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = ey - worker->min_ey;
  if (worker->max_ex < ex) {
    ex = worker->max_ex;
  }
  lVar2 = ex - worker->min_ex;
  lVar4 = -1;
  if (-1 < lVar2) {
    lVar4 = lVar2;
  }
  if ((lVar4 != worker->ex) || (lVar3 != worker->ey)) {
    if (worker->invalid == 0) {
      gray_record_cell(worker);
    }
    worker->area = 0;
    worker->cover = 0;
    worker->ex = lVar4;
    worker->ey = lVar3;
  }
  uVar1 = 1;
  if ((uint)lVar3 < (uint)worker->count_ey) {
    uVar1 = (uint)(worker->count_ex <= lVar4);
  }
  worker->invalid = uVar1;
  return;
}

Assistant:

static void
  gray_set_cell( RAS_ARG_ TCoord  ex,
                          TCoord  ey )
  {
    /* Move the cell pointer to a new position.  We set the `invalid'      */
    /* flag to indicate that the cell isn't part of those we're interested */
    /* in during the render phase.  This means that:                       */
    /*                                                                     */
    /* . the new vertical position must be within min_ey..max_ey-1.        */
    /* . the new horizontal position must be strictly less than max_ex     */
    /*                                                                     */
    /* Note that if a cell is to the left of the clipping region, it is    */
    /* actually set to the (min_ex-1) horizontal position.                 */

    /* All cells that are on the left of the clipping region go to the */
    /* min_ex - 1 horizontal position.                                 */
    ey -= ras.min_ey;

    if ( ex > ras.max_ex )
      ex = ras.max_ex;

    ex -= ras.min_ex;
    if ( ex < 0 )
      ex = -1;

    /* are we moving to a different cell ? */
    if ( ex != ras.ex || ey != ras.ey )
    {
      /* record the current one if it is valid */
      if ( !ras.invalid )
        gray_record_cell( RAS_VAR );

      ras.area  = 0;
      ras.cover = 0;
      ras.ex    = ex;
      ras.ey    = ey;
    }

    ras.invalid = ( (unsigned int)ey >= (unsigned int)ras.count_ey ||
                                  ex >= ras.count_ex           );
  }